

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Cluster::AddFrameWithDiscardPadding
          (Cluster *this,uint8_t *data,uint64_t length,int64_t discard_padding,uint64_t track_number
          ,uint64_t abs_timecode,bool is_key)

{
  bool bVar1;
  int64_t in_RCX;
  uint64_t in_RDI;
  uint64_t in_R8;
  uint64_t in_R9;
  byte in_stack_00000008;
  Frame *in_stack_00000010;
  Cluster *in_stack_00000018;
  Frame frame;
  Frame *in_stack_ffffffffffffff40;
  Frame *in_stack_ffffffffffffff48;
  Frame local_a8;
  byte local_39;
  uint64_t local_38;
  uint64_t local_30;
  int64_t local_28;
  bool local_1;
  
  local_39 = in_stack_00000008 & 1;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  Frame::Frame(&local_a8);
  bVar1 = Frame::Init(in_stack_ffffffffffffff48,(uint8_t *)in_stack_ffffffffffffff40,in_RDI);
  if (bVar1) {
    Frame::set_discard_padding(&local_a8,local_28);
    Frame::set_track_number(&local_a8,local_30);
    Frame::set_timestamp(&local_a8,local_38);
    Frame::set_is_key(&local_a8,(bool)(local_39 & 1));
    local_1 = QueueOrWriteFrame(in_stack_00000018,in_stack_00000010);
  }
  else {
    local_1 = false;
  }
  Frame::~Frame(in_stack_ffffffffffffff40);
  return (bool)(local_1 & 1);
}

Assistant:

bool Cluster::AddFrameWithDiscardPadding(const uint8_t* data, uint64_t length,
                                         int64_t discard_padding,
                                         uint64_t track_number,
                                         uint64_t abs_timecode, bool is_key) {
  Frame frame;
  if (!frame.Init(data, length))
    return false;
  frame.set_discard_padding(discard_padding);
  frame.set_track_number(track_number);
  frame.set_timestamp(abs_timecode);
  frame.set_is_key(is_key);
  return QueueOrWriteFrame(&frame);
}